

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

aiReturn __thiscall Assimp::Exporter::RegisterExporter(Exporter *this,ExportFormatEntry *desc)

{
  bool bVar1;
  int iVar2;
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  *this_00;
  reference pEVar3;
  ExportFormatEntry *e;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  *__range1;
  ExportFormatEntry *desc_local;
  Exporter *this_local;
  
  this_00 = &this->pimpl->mExporters;
  __end1 = std::
           vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ::begin(this_00);
  e = (ExportFormatEntry *)
      std::
      vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
                                *)&e);
    if (!bVar1) {
      std::
      vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ::push_back(&this->pimpl->mExporters,desc);
      return aiReturn_SUCCESS;
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
             ::operator*(&__end1);
    iVar2 = strcmp((pEVar3->mDescription).id,(desc->mDescription).id);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<Assimp::Exporter::ExportFormatEntry_*,_std::vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>_>
    ::operator++(&__end1);
  }
  return aiReturn_FAILURE;
}

Assistant:

aiReturn Exporter::RegisterExporter(const ExportFormatEntry& desc) {
    for(const ExportFormatEntry& e : pimpl->mExporters) {
        if (!strcmp(e.mDescription.id,desc.mDescription.id)) {
            return aiReturn_FAILURE;
        }
    }

    pimpl->mExporters.push_back(desc);
    return aiReturn_SUCCESS;
}